

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O1

void GPU_Vector4ApplyMatrix(float *vec4,float *matrix_4x4)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar4 = *vec4;
  fVar1 = vec4[1];
  fVar2 = vec4[2];
  fVar3 = vec4[3];
  fVar5 = matrix_4x4[0xc] * fVar3 +
          matrix_4x4[8] * fVar2 + *matrix_4x4 * fVar4 + matrix_4x4[4] * fVar1;
  fVar6 = matrix_4x4[0xd] * fVar3 +
          matrix_4x4[9] * fVar2 + matrix_4x4[1] * fVar4 + matrix_4x4[5] * fVar1;
  fVar7 = matrix_4x4[0xe] * fVar3 +
          matrix_4x4[10] * fVar2 + matrix_4x4[2] * fVar4 + matrix_4x4[6] * fVar1;
  fVar4 = fVar3 * matrix_4x4[0xf] +
          fVar2 * matrix_4x4[0xb] + fVar4 * matrix_4x4[3] + fVar1 * matrix_4x4[7];
  *vec4 = fVar5;
  vec4[1] = fVar6;
  vec4[2] = fVar7;
  vec4[3] = fVar4;
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    *vec4 = fVar5 / fVar4;
    vec4[1] = fVar6 / fVar4;
    vec4[2] = fVar7 / fVar4;
    vec4[3] = 1.0;
  }
  return;
}

Assistant:

void GPU_Vector4ApplyMatrix(float* vec4, const float* matrix_4x4)
{
	float x = matrix_4x4[0] * vec4[0] + matrix_4x4[4] * vec4[1] + matrix_4x4[8] * vec4[2] + matrix_4x4[12] * vec4[3];
	float y = matrix_4x4[1] * vec4[0] + matrix_4x4[5] * vec4[1] + matrix_4x4[9] * vec4[2] + matrix_4x4[13] * vec4[3];
	float z = matrix_4x4[2] * vec4[0] + matrix_4x4[6] * vec4[1] + matrix_4x4[10] * vec4[2] + matrix_4x4[14] * vec4[3];
	float w = matrix_4x4[3] * vec4[0] + matrix_4x4[7] * vec4[1] + matrix_4x4[11] * vec4[2] + matrix_4x4[15] * vec4[3];
	
    vec4[0] = x;
    vec4[1] = y;
    vec4[2] = z;
    vec4[3] = w;
	if(w != 0.0f)
    {
        vec4[0] = x / w;
        vec4[1] = y / w;
        vec4[2] = z / w;
        vec4[3] = 1;
    }
}